

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O0

int envy_bios_parse_conn(envy_bios *bios)

{
  uint8_t uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  envy_bios_conn *peVar7;
  envy_bios_conn_entry *peVar8;
  int local_44;
  uint local_40;
  int j;
  uint32_t val;
  uint8_t bytes [4];
  envy_bios_conn_entry *entry;
  int i;
  int wantrlen;
  int wanthlen;
  int err;
  envy_bios_conn *conn;
  envy_bios *bios_local;
  
  peVar7 = &bios->conn;
  if (peVar7->offset == 0) {
    bios_local._4_4_ = 0;
  }
  else {
    iVar3 = bios_u8(bios,(uint)peVar7->offset,&(bios->conn).version);
    iVar4 = bios_u8(bios,peVar7->offset + 1,&(bios->conn).hlen);
    iVar5 = bios_u8(bios,peVar7->offset + 2,&(bios->conn).entriesnum);
    iVar6 = bios_u8(bios,peVar7->offset + 3,&(bios->conn).rlen);
    if (iVar6 == 0 && (iVar5 == 0 && (iVar4 == 0 && iVar3 == 0))) {
      envy_bios_block(bios,(uint)peVar7->offset,
                      (uint)(bios->conn).hlen +
                      (uint)(bios->conn).rlen * (uint)(bios->conn).entriesnum,"CONN",-1);
      entry._4_4_ = 4;
      if ((bios->conn).rlen < 4) {
        entry._4_4_ = 2;
      }
      uVar1 = (bios->conn).version;
      if ((uVar1 == '0') || (uVar1 == '@')) {
        if ((bios->conn).hlen < 5) {
          fprintf(_stderr,"CONN table header too short [%d < %d]\n",(ulong)(bios->conn).hlen,5);
          bios_local._4_4_ = -0x16;
        }
        else if ((bios->conn).rlen < entry._4_4_) {
          fprintf(_stderr,"CONN table record too short [%d < %d]\n",(ulong)(bios->conn).rlen,
                  (ulong)entry._4_4_);
          bios_local._4_4_ = -0x16;
        }
        else {
          if (5 < (bios->conn).hlen) {
            fprintf(_stderr,"CONN table header longer than expected [%d > %d]\n",
                    (ulong)(bios->conn).hlen,5);
          }
          if (entry._4_4_ < (bios->conn).rlen) {
            fprintf(_stderr,"CONN table record longer than expected [%d > %d]\n",
                    (ulong)(bios->conn).rlen,(ulong)entry._4_4_);
          }
          peVar8 = (envy_bios_conn_entry *)calloc((ulong)(bios->conn).entriesnum,10);
          (bios->conn).entries = peVar8;
          if ((bios->conn).entries == (envy_bios_conn_entry *)0x0) {
            bios_local._4_4_ = -0xc;
          }
          else {
            for (entry._0_4_ = 0; (int)(uint)entry < (int)(uint)(bios->conn).entriesnum;
                entry._0_4_ = (uint)entry + 1) {
              _val = (bios->conn).entries + (int)(uint)entry;
              _val->offset = peVar7->offset + (ushort)(bios->conn).hlen +
                             (ushort)(bios->conn).rlen * (short)(uint)entry;
              memset(&j,0,4);
              local_40 = 0;
              _val->hpd = -1;
              _val->dp_ext = -1;
              local_44 = 0;
              while( true ) {
                bVar2 = false;
                if (local_44 < 4) {
                  bVar2 = local_44 < (int)(uint)(bios->conn).rlen;
                }
                if (!bVar2) break;
                iVar3 = bios_u8(bios,(uint)_val->offset + local_44,
                                (uint8_t *)((long)&j + (long)local_44));
                if (iVar3 != 0) {
                  return -0xe;
                }
                local_40 = (uint)*(byte *)((long)&j + (long)local_44) <<
                           ((byte)(local_44 << 3) & 0x1f) | local_40;
                local_44 = local_44 + 1;
              }
              _val->type = (uint8_t)j;
              _val->tag = j._1_1_ & 0xf;
              for (local_44 = 0; local_44 < 7; local_44 = local_44 + 1) {
                if ((local_40 & 1 << ((byte)envy_bios_parse_conn::hpds[local_44] & 0x1f)) != 0) {
                  if (_val->hpd == -1) {
                    _val->hpd = (int8_t)local_44;
                  }
                  else {
                    fprintf(_stderr,"CONN %d: duplicate HPD bits\n",(ulong)(uint)entry);
                  }
                }
              }
              for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
                if ((local_40 & 1 << ((char)local_44 + 0xeU & 0x1f)) != 0) {
                  if (_val->dp_ext == -1) {
                    _val->dp_ext = (char)local_44;
                  }
                  else {
                    fprintf(_stderr,"CONN %d: duplicate DP_AUX bits\n",(ulong)(uint)entry);
                  }
                }
              }
              _val->unk02_2 = (byte)((int)(uint)j._2_1_ >> 2) & 3;
              _val->unk02_4 = (byte)((int)(uint)j._2_1_ >> 4) & 7;
              _val->unk02_7 = (uint8_t)((int)(uint)j._2_1_ >> 7);
              _val->unk03_3 = (uint8_t)((int)(uint)j._3_1_ >> 3);
            }
            (bios->conn).valid = '\x01';
            bios_local._4_4_ = 0;
          }
        }
      }
      else {
        fprintf(_stderr,"Unknown CONN table version %d.%d\n",
                (ulong)(uint)((int)(uint)(bios->conn).version >> 4),
                (ulong)((bios->conn).version & 0xf));
        bios_local._4_4_ = -0x16;
      }
    }
    else {
      bios_local._4_4_ = -0xe;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_conn (struct envy_bios *bios) {
	struct envy_bios_conn *conn = &bios->conn;
	if (!conn->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, conn->offset, &conn->version);
	err |= bios_u8(bios, conn->offset+1, &conn->hlen);
	err |= bios_u8(bios, conn->offset+2, &conn->entriesnum);
	err |= bios_u8(bios, conn->offset+3, &conn->rlen);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, conn->offset, conn->hlen + conn->rlen * conn->entriesnum, "CONN", -1);
	int wanthlen = 5;
	int wantrlen = 4;
	if (conn->rlen < 4)
		wantrlen = 2;
	switch (conn->version) {
		case 0x30:
		case 0x40:
			break;
		default:
			ENVY_BIOS_ERR("Unknown CONN table version %d.%d\n", conn->version >> 4, conn->version & 0xf);
			return -EINVAL;
	}
	if (conn->hlen < wanthlen) {
		ENVY_BIOS_ERR("CONN table header too short [%d < %d]\n", conn->hlen, wanthlen);
		return -EINVAL;
	}
	if (conn->rlen < wantrlen) {
		ENVY_BIOS_ERR("CONN table record too short [%d < %d]\n", conn->rlen, wantrlen);
		return -EINVAL;
	}
	if (conn->hlen > wanthlen) {
		ENVY_BIOS_WARN("CONN table header longer than expected [%d > %d]\n", conn->hlen, wanthlen);
	}
	if (conn->rlen > wantrlen) {
		ENVY_BIOS_WARN("CONN table record longer than expected [%d > %d]\n", conn->rlen, wantrlen);
	}
	conn->entries = calloc(conn->entriesnum, sizeof *conn->entries);
	if (!conn->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < conn->entriesnum; i++) {
		struct envy_bios_conn_entry *entry = &conn->entries[i];
		entry->offset = conn->offset + conn->hlen + conn->rlen * i;
		uint8_t bytes[4] = { 0 };
		uint32_t val = 0;
		int j;
		static const int hpds[7] = { 12, 13, 16, 17, 24, 25, 26 };
		entry->hpd = -1;
		entry->dp_ext = -1;
		for (j = 0; j < 4 && j < conn->rlen; j++) {
			err |= bios_u8(bios, entry->offset+j, &bytes[j]);
			if (err)
				return -EFAULT;
			val |= bytes[j] << j * 8;
		}
		entry->type = bytes[0];
		entry->tag = bytes[1] & 0xf;
		for (j = 0; j < 7; j++) {
			if (val & 1 << hpds[j]) {
				if (entry->hpd == -1)
					entry->hpd = j;
				else
					ENVY_BIOS_ERR("CONN %d: duplicate HPD bits\n", i);
			}
		}
		for (j = 0; j < 2; j++) {
			if (val & 1 << (j+14)) {
				if (entry->dp_ext == -1)
					entry->dp_ext = j;
				else
					ENVY_BIOS_ERR("CONN %d: duplicate DP_AUX bits\n", i);
			}
		}
		entry->unk02_2 = bytes[2] >> 2 & 3;
		entry->unk02_4 = bytes[2] >> 4 & 7;
		entry->unk02_7 = bytes[2] >> 7 & 1;
		entry->unk03_3 = bytes[3] >> 3 & 0x1f;
	}
	conn->valid = 1;
	return 0;
}